

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_input.c
# Opt level: O0

int streamReply(mpt_reply_context *rc,mpt_message *msg)

{
  undefined8 local_38;
  uint64_t id;
  mpt_reply_context *pmStack_28;
  int ret;
  mpt_streamInput *srm;
  mpt_message *msg_local;
  mpt_reply_context *rc_local;
  
  pmStack_28 = rc + -0x15;
  srm = (mpt_streamInput *)msg;
  msg_local = (mpt_message *)rc;
  if (*(short *)((long)&rc[1]._vptr + 2) == 0) {
    mpt_log(0,"mpt::stream::reply",4,"%s: %s","bad reply operation","reply already sent");
    rc_local._4_4_ = -1;
  }
  else {
    id._4_4_ = mpt_stream_reply((mpt_stream *)(rc + -0x13),
                                (ulong)*(ushort *)((long)&rc[1]._vptr + 2),
                                (void *)((long)&rc[1]._vptr + 4),msg);
    if (id._4_4_ < 0) {
      local_38 = 0;
      mpt_message_buf2id((undefined1 *)((long)&pmStack_28[0x16]._vptr + 4),
                         *(undefined2 *)((long)&pmStack_28[0x16]._vptr + 2),&local_38);
      mpt_log(0,"mpt::stream::reply",4,"%s: %s","bad reply operation","unable to send");
      rc_local._4_4_ = -1;
    }
    else {
      *(undefined2 *)((long)&pmStack_28[0x16]._vptr + 2) = 0;
      rc_local._4_4_ = id._4_4_;
    }
  }
  return rc_local._4_4_;
}

Assistant:

static int streamReply(MPT_INTERFACE(reply_context) *rc, const MPT_STRUCT(message) *msg)
{
	MPT_STRUCT(streamInput) *srm = MPT_baseaddr(streamInput, rc, _rc);
	static const char _func[] = "mpt::stream::reply";
	int ret;
	
	if (!srm->rd.len) {
		mpt_log(0, _func, MPT_LOG(Warning), "%s: %s",
		        MPT_tr("bad reply operation"), MPT_tr("reply already sent"));
		return MPT_ERROR(BadArgument);
	}
	ret = mpt_stream_reply(&srm->data, srm->rd.len, srm->rd.val, msg);
	
	if (ret >= 0) {
		srm->rd.len = 0;
	} else {
		uint64_t id = 0;
		mpt_message_buf2id(srm->rd.val, srm->rd.len, &id);
		mpt_log(0, _func, MPT_LOG(Warning), "%s: %s",
		        MPT_tr("bad reply operation"), MPT_tr("unable to send"));
		return MPT_ERROR(BadArgument);
	}
	return ret;
}